

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
stx::
btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
::split_inner_node(btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
                   *this,inner_node *inner,key_type *_newkey,node **_newinner,uint addslot)

{
  ushort uVar1;
  inner_node *piVar2;
  ulong uVar3;
  size_t __n;
  uint uVar4;
  
  uVar1 = (inner->super_node).slotuse;
  uVar4 = (uint)(uVar1 >> 1);
  if (addslot <= uVar4) {
    uVar4 = uVar4 - (~uVar4 + (uint)uVar1 < uVar4);
  }
  piVar2 = allocate_inner(this,(inner->super_node).level);
  (piVar2->super_node).slotuse = ~(ushort)uVar4 + (inner->super_node).slotuse;
  uVar3 = (ulong)(inner->super_node).slotuse;
  __n = (long)inner + ((uVar3 * 8 + 8) - (long)(inner->slotkey + (ulong)uVar4 + 1));
  if (__n != 0) {
    memmove(piVar2->slotkey,inner->slotkey + (ulong)uVar4 + 1,__n);
    uVar3 = (ulong)(inner->super_node).slotuse;
  }
  if ((uint)uVar3 != uVar4) {
    memmove(piVar2->childid,inner->childid + (ulong)uVar4 + 1,
            (long)inner + (uVar3 * 8 - (long)(inner->childid + (ulong)uVar4 + 1)) + 0x90);
  }
  (inner->super_node).slotuse = (ushort)uVar4;
  *_newkey = inner->slotkey[uVar4];
  *_newinner = &piVar2->super_node;
  return;
}

Assistant:

void split_inner_node(inner_node* inner, key_type* _newkey, node** _newinner, unsigned int addslot)
        {
            BTREE_ASSERT(inner->isfull());

            unsigned int mid = (inner->slotuse >> 1);

            BTREE_PRINT("btree::split_inner: mid " << mid << " addslot " << addslot);

            // if the split is uneven and the overflowing item will be put into the
            // larger node, then the smaller split node may underflow
            if (addslot <= mid && mid > inner->slotuse - (mid + 1))
                mid--;

            BTREE_PRINT("btree::split_inner: mid " << mid << " addslot " << addslot);

            BTREE_PRINT("btree::split_inner_node on " << inner << " into two nodes " << mid << " and " << inner->slotuse - (mid + 1) << " sized");

            inner_node *newinner = allocate_inner(inner->level);

            newinner->slotuse = inner->slotuse - (mid + 1);

            std::copy(inner->slotkey + mid+1, inner->slotkey + inner->slotuse,
                      newinner->slotkey);
            std::copy(inner->childid + mid+1, inner->childid + inner->slotuse+1,
                      newinner->childid);

            inner->slotuse = mid;

            *_newkey = inner->slotkey[mid];
            *_newinner = newinner;
        }